

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O2

void __thiscall tf::Notifier::notify_n(Notifier *this,size_t n)

{
  bool bVar1;
  
  if ((ulong)(((long)(this->_waiters).
                     super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_waiters).
                    super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x70) <= n) {
    notify(this,true);
    return;
  }
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    notify(this,false);
  }
  return;
}

Assistant:

void notify_n(size_t n) {
    if(n >= _waiters.size()) {
      notify(true);
    }
    else {
      for(size_t k=0; k<n; ++k) {
        notify(false);
      }
    }
  }